

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_global_encodeURI(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int isComponent)

{
  JSValueUnion p_00;
  JSValue v;
  JSValue v_00;
  int iVar1;
  int iVar2;
  JSContext *in_RDI;
  JSValue JVar3;
  int c1;
  int c;
  int k;
  JSString *p;
  StringBuffer *b;
  StringBuffer b_s;
  JSValue str;
  StringBuffer *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int isComponent_00;
  undefined4 in_stack_ffffffffffffff64;
  int c_00;
  undefined4 uVar4;
  int c_01;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  uint local_88;
  int local_84;
  undefined1 local_10 [8];
  int64_t local_8;
  
  JVar3.tag._0_4_ = in_stack_ffffffffffffff60;
  JVar3.u.ptr = in_stack_ffffffffffffff58;
  JVar3.tag._4_4_ = in_stack_ffffffffffffff64;
  JVar3 = JS_ToString((JSContext *)0x1b6090,JVar3);
  isComponent_00 = JVar3.u._0_4_;
  c_00 = JVar3.u._4_4_;
  uVar4 = (undefined4)JVar3.tag;
  c_01 = JVar3.tag._4_4_;
  p_00 = JVar3.u;
  iVar1 = JS_IsException(JVar3);
  if (iVar1 == 0) {
    string_buffer_init((JSContext *)CONCAT44(c_00,isComponent_00),in_stack_ffffffffffffff58,0);
    local_84 = 0;
    while (local_84 < (int)((uint)*(undefined8 *)((long)p_00.ptr + 4) & 0x7fffffff)) {
      local_88 = string_get((JSString *)p_00.ptr,local_84);
      iVar1 = local_84 + 1;
      iVar2 = isURIUnescaped(c_00,isComponent_00);
      if (iVar2 == 0) {
        if ((0xdbff < (int)local_88) && ((int)local_88 < 0xe000)) {
          js_throw_URIError(in_RDI,"invalid character");
          goto LAB_001b6360;
        }
        if ((0xd7ff < (int)local_88) && ((int)local_88 < 0xdc00)) {
          if ((int)((uint)*(undefined8 *)((long)p_00.ptr + 4) & 0x7fffffff) <= iVar1) {
            js_throw_URIError(in_RDI,"expecting surrogate pair");
LAB_001b6360:
            v_00.u._4_4_ = c_01;
            v_00.u.int32 = uVar4;
            v_00.tag._0_4_ = in_stack_ffffffffffffff70;
            v_00.tag._4_4_ = in_stack_ffffffffffffff74;
            JS_FreeValue((JSContext *)CONCAT44(c_00,isComponent_00),v_00);
            string_buffer_free((StringBuffer *)0x1b6381);
            local_10 = (undefined1  [8])(stack0xfffffffffffffff4 << 0x20);
            local_8 = 6;
            return _local_10;
          }
          in_stack_ffffffffffffff74 = string_get((JSString *)p_00.ptr,iVar1);
          if (((int)in_stack_ffffffffffffff74 < 0xdc00) || (0xdfff < (int)in_stack_ffffffffffffff74)
             ) {
            js_throw_URIError(in_RDI,"expecting surrogate pair");
            goto LAB_001b6360;
          }
          local_88 = ((local_88 & 0x3ff) << 10 | in_stack_ffffffffffffff74 & 0x3ff) + 0x10000;
          iVar1 = local_84 + 2;
        }
        local_84 = iVar1;
        if ((int)local_88 < 0x80) {
          encodeURI_hex((StringBuffer *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),c_01);
        }
        else {
          if ((int)local_88 < 0x800) {
            encodeURI_hex((StringBuffer *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),c_01);
          }
          else {
            if ((int)local_88 < 0x10000) {
              encodeURI_hex((StringBuffer *)
                            CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),c_01);
            }
            else {
              encodeURI_hex((StringBuffer *)
                            CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),c_01);
              encodeURI_hex((StringBuffer *)
                            CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),c_01);
            }
            encodeURI_hex((StringBuffer *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),c_01);
          }
          encodeURI_hex((StringBuffer *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),c_01);
        }
      }
      else {
        string_buffer_putc16(in_stack_ffffffffffffff58,0);
        local_84 = iVar1;
      }
    }
    v.u._4_4_ = c_01;
    v.u.int32 = uVar4;
    v.tag._0_4_ = in_stack_ffffffffffffff70;
    v.tag._4_4_ = in_stack_ffffffffffffff74;
    JS_FreeValue((JSContext *)CONCAT44(c_00,isComponent_00),v);
    JVar3 = string_buffer_end((StringBuffer *)CONCAT44(c_00,isComponent_00));
  }
  _local_10 = JVar3;
  return _local_10;
}

Assistant:

static JSValue js_global_encodeURI(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv,
                                   int isComponent)
{
    JSValue str;
    StringBuffer b_s, *b = &b_s;
    JSString *p;
    int k, c, c1;

    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        return str;

    p = JS_VALUE_GET_STRING(str);
    string_buffer_init(ctx, b, p->len);
    for (k = 0; k < p->len;) {
        c = string_get(p, k);
        k++;
        if (isURIUnescaped(c, isComponent)) {
            string_buffer_putc16(b, c);
        } else {
            if (c >= 0xdc00 && c <= 0xdfff) {
                js_throw_URIError(ctx, "invalid character");
                goto fail;
            } else if (c >= 0xd800 && c <= 0xdbff) {
                if (k >= p->len) {
                    js_throw_URIError(ctx, "expecting surrogate pair");
                    goto fail;
                }
                c1 = string_get(p, k);
                k++;
                if (c1 < 0xdc00 || c1 > 0xdfff) {
                    js_throw_URIError(ctx, "expecting surrogate pair");
                    goto fail;
                }
                c = (((c & 0x3ff) << 10) | (c1 & 0x3ff)) + 0x10000;
            }
            if (c < 0x80) {
                encodeURI_hex(b, c);
            } else {
                /* XXX: use C UTF-8 conversion ? */
                if (c < 0x800) {
                    encodeURI_hex(b, (c >> 6) | 0xc0);
                } else {
                    if (c < 0x10000) {
                        encodeURI_hex(b, (c >> 12) | 0xe0);
                    } else {
                        encodeURI_hex(b, (c >> 18) | 0xf0);
                        encodeURI_hex(b, ((c >> 12) & 0x3f) | 0x80);
                    }
                    encodeURI_hex(b, ((c >> 6) & 0x3f) | 0x80);
                }
                encodeURI_hex(b, (c & 0x3f) | 0x80);
            }
        }
    }
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);

fail:
    JS_FreeValue(ctx, str);
    string_buffer_free(b);
    return JS_EXCEPTION;
}